

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O2

void __thiscall Nes_Dmc::run(Nes_Dmc *this,nes_time_t time,nes_time_t end_time)

{
  int iVar1;
  Blip_Buffer *pBVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint t;
  int iVar7;
  uint uVar8;
  uint uVar9;
  
  iVar7 = this->dac;
  iVar1 = (this->super_Nes_Osc).last_amp;
  (this->super_Nes_Osc).last_amp = iVar7;
  pBVar2 = (this->super_Nes_Osc).output;
  if (pBVar2 == (Blip_Buffer *)0x0) {
    this->silence = true;
  }
  else {
    pBVar2->modified_ = 1;
    if (iVar7 != iVar1) {
      Blip_Synth<8,_1>::offset(&this->synth,time,iVar7 - iVar1,pBVar2);
    }
  }
  t = time + (this->super_Nes_Osc).delay;
  if ((int)t < end_time) {
    iVar7 = this->bits_remain;
    if ((this->silence == true) && (this->buf_full == false)) {
      iVar1 = this->period;
      uVar3 = (long)(int)(~t + end_time + iVar1) / (long)iVar1;
      iVar5 = (int)uVar3;
      iVar7 = ((iVar7 - (int)((long)((ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) % 8)
               ) + 7) % 8 + 1;
      t = t + iVar5 * iVar1;
    }
    else {
      pBVar2 = (this->super_Nes_Osc).output;
      iVar1 = this->period;
      uVar8 = this->bits;
      uVar6 = this->dac;
      do {
        if (this->silence == false) {
          uVar4 = uVar8 & 1;
          uVar8 = (int)uVar8 >> 1;
          uVar9 = (uVar6 + uVar4 * 4) - 2;
          if (uVar9 < 0x80) {
            Blip_Synth<8,_1>::offset_inline(&this->synth,t,uVar4 * 4 + -2,pBVar2);
            uVar6 = uVar9;
          }
        }
        iVar7 = iVar7 + -1;
        if (iVar7 == 0) {
          if (this->buf_full == false) {
            this->silence = true;
            iVar7 = 8;
          }
          else {
            this->buf_full = false;
            this->silence = false;
            if (pBVar2 == (Blip_Buffer *)0x0) {
              this->silence = true;
            }
            uVar8 = this->buf;
            fill_buffer(this);
            iVar7 = 8;
          }
        }
        t = t + iVar1;
      } while ((int)t < end_time);
      this->dac = uVar6;
      (this->super_Nes_Osc).last_amp = uVar6;
      this->bits = uVar8;
    }
    this->bits_remain = iVar7;
  }
  (this->super_Nes_Osc).delay = t - end_time;
  return;
}

Assistant:

void Nes_Dmc::run( nes_time_t time, nes_time_t end_time )
{
	int delta = update_amp( dac );
	if ( !output )
	{
		silence = true;
	}
	else
	{
		output->set_modified();
		if ( delta )
			synth.offset( time, delta, output );
	}
	
	time += delay;
	if ( time < end_time )
	{
		int bits_remain = this->bits_remain;
		if ( silence && !buf_full )
		{
			int count = (end_time - time + period - 1) / period;
			bits_remain = (bits_remain - 1 + 8 - (count % 8)) % 8 + 1;
			time += count * period;
		}
		else
		{
			Blip_Buffer* const output = this->output;
			const int period = this->period;
			int bits = this->bits;
			int dac = this->dac;
			
			do
			{
				if ( !silence )
				{
					int step = (bits & 1) * 4 - 2;
					bits >>= 1;
					if ( unsigned (dac + step) <= 0x7F ) {
						dac += step;
						synth.offset_inline( time, step, output );
					}
				}
				
				time += period;
				
				if ( --bits_remain == 0 )
				{
					bits_remain = 8;
					if ( !buf_full ) {
						silence = true;
					}
					else {
						silence = false;
						bits = buf;
						buf_full = false;
						if ( !output )
							silence = true;
						fill_buffer();
					}
				}
			}
			while ( time < end_time );
			
			this->dac = dac;
			this->last_amp = dac;
			this->bits = bits;
		}
		this->bits_remain = bits_remain;
	}
	delay = time - end_time;
}